

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunator.hpp
# Opt level: O3

size_t __thiscall
delaunator::Delaunator::add_triangle
          (Delaunator *this,size_t i0,size_t i1,size_t i2,size_t a,size_t b,size_t c)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  iterator __position;
  unsigned_long *puVar1;
  iterator iVar2;
  char *__from;
  size_t local_60;
  size_t i0_local;
  size_t i1_local;
  size_t i2_local;
  char *local_40;
  pointer local_38;
  
  this_00 = &this->triangles;
  local_38 = (this->triangles).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->triangles).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  puVar1 = (this->triangles).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_60 = i0;
  i0_local = i1;
  i1_local = i2;
  i2_local = b;
  local_40 = (char *)a;
  if (__position._M_current == puVar1) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)this_00,__position,&local_60);
    iVar2._M_current =
         (this->triangles).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
         .super__Vector_impl_data._M_finish;
    puVar1 = (this->triangles).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *__position._M_current = i0;
    iVar2._M_current = __position._M_current + 1;
    (this->triangles).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  if (iVar2._M_current == puVar1) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)this_00,iVar2,&i0_local);
    iVar2._M_current =
         (this->triangles).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
         .super__Vector_impl_data._M_finish;
    puVar1 = (this->triangles).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = i1;
    iVar2._M_current = iVar2._M_current + 1;
    (this->triangles).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  if (iVar2._M_current == puVar1) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)this_00,iVar2,&i1_local);
  }
  else {
    *iVar2._M_current = i2;
    (this->triangles).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  __from = (char *)((long)__position._M_current - (long)local_38 >> 3);
  link(this,__from,local_40);
  link(this,__from + 1,(char *)i2_local);
  link(this,__from + 2,(char *)c);
  return (size_t)__from;
}

Assistant:

std::size_t Delaunator::add_triangle(
    std::size_t i0,
    std::size_t i1,
    std::size_t i2,
    std::size_t a,
    std::size_t b,
    std::size_t c) {
    std::size_t t = triangles.size();
    triangles.push_back(i0);
    triangles.push_back(i1);
    triangles.push_back(i2);
    link(t, a);
    link(t + 1, b);
    link(t + 2, c);
    return t;
}